

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

bool __thiscall llvm::DWARFDebugNames::ValueIterator::getEntryAtCurrentOffset(ValueIterator *this)

{
  bool bVar1;
  reference y;
  undefined1 local_f0 [24];
  undefined1 local_d8 [8];
  Expected<llvm::DWARFDebugNames::Entry> EntryOr;
  ValueIterator *this_local;
  
  EntryOr._184_8_ = this;
  NameIndex::getEntry((Expected<llvm::DWARFDebugNames::Entry> *)local_d8,this->CurrentIndex,
                      &this->DataOffset);
  bVar1 = llvm::Expected::operator_cast_to_bool((Expected *)local_d8);
  if (bVar1) {
    y = Expected<llvm::DWARFDebugNames::Entry>::operator*
                  ((Expected<llvm::DWARFDebugNames::Entry> *)local_d8);
    Optional<llvm::DWARFDebugNames::Entry>::operator=(&this->CurrentEntry,y);
  }
  else {
    Expected<llvm::DWARFDebugNames::Entry>::takeError
              ((Expected<llvm::DWARFDebugNames::Entry> *)local_f0);
    consumeError((Error *)local_f0);
    Error::~Error((Error *)local_f0);
  }
  Expected<llvm::DWARFDebugNames::Entry>::~Expected
            ((Expected<llvm::DWARFDebugNames::Entry> *)local_d8);
  return bVar1;
}

Assistant:

bool DWARFDebugNames::ValueIterator::getEntryAtCurrentOffset() {
  auto EntryOr = CurrentIndex->getEntry(&DataOffset);
  if (!EntryOr) {
    consumeError(EntryOr.takeError());
    return false;
  }
  CurrentEntry = std::move(*EntryOr);
  return true;
}